

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfo.cpp
# Opt level: O2

void GmmResFree(GMM_RESOURCE_INFO *pRes)

{
  int iVar1;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  GmmResourceInfoCommon local_6a8;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (pRes != (GMM_RESOURCE_INFO *)0x0) {
    iVar1 = (*(pRes->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])();
    if ((*(byte *)(CONCAT44(extraout_var,iVar1) + 0xd) & 2) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        (*(pRes->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[4])(pRes);
        return;
      }
      goto LAB_001a8a24;
    }
    local_6a8.ClientType = GMM_KMD_VISTA;
    memset(&local_6a8.Surf,0,0x61c);
    local_6a8.ExistingSysMem.pExistingSysMem = 0;
    local_6a8.ExistingSysMem.pVirtAddress = 0;
    local_6a8.ExistingSysMem.pGfxAlignedVirtAddress = 0;
    local_6a8.ExistingSysMem.Size = 0;
    local_6a8.ExistingSysMem.IsGmmAllocated = '\0';
    local_6a8.ExistingSysMem._33_7_ = 0;
    local_6a8.SvmAddress = 0;
    local_6a8.pGmmUmdLibContext = 0;
    local_6a8.pGmmKmdLibContext = 0;
    local_6a8.MultiTileArch._0_1_ = 0;
    local_6a8.MultiTileArch.GpuVaMappingSet = '\0';
    local_6a8.MultiTileArch.LocalMemEligibilitySet = '\0';
    local_6a8.MultiTileArch.LocalMemPreferredSet = '\0';
    local_6a8.MultiTileArch.Reserved = 0;
    local_6a8.pPrivateData = 0;
    local_6a8.pClientContext = (GmmClientContext *)0x0;
    local_6a8._vptr_GmmResourceInfoCommon = (_func_int **)&PTR_IsPresentableformat_001d2828;
    GmmLib::GmmResourceInfoCommon::operator=(&pRes->super_GmmResourceInfoCommon,&local_6a8);
    GmmLib::GmmResourceInfoCommon::~GmmResourceInfoCommon(&local_6a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_001a8a24:
  __stack_chk_fail();
}

Assistant:

void GMM_STDCALL GmmResFree(GMM_RESOURCE_INFO *pRes)
{
    GMM_DPF_ENTER;
    __GMM_ASSERTPTR(pRes, VOIDRETURN);

#if(!defined(__GMM_KMD__) && !defined(GMM_UNIFIED_LIB))
    GmmResFreeThroughClientCtxt(pRes);
#else

    if(pRes->GetResFlags().Info.__PreallocatedResInfo)
    {
        *pRes = GmmLib::GmmResourceInfo();
    }
    else
    {
        delete pRes;
        pRes = NULL;
    }

#endif
}